

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O1

void cross_validate_outputs_to_inputs
               (gl_context *ctx,gl_shader_program *prog,gl_linked_shader *producer,
               gl_linked_shader *consumer)

{
  exec_node *peVar1;
  exec_node *peVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ir_variable *piVar8;
  ir_variable *piVar9;
  glsl_type *this;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  explicit_location_info *peVar13;
  exec_node **var;
  glsl_symbol_table parameters;
  explicit_location_info output_explicit_locations [32] [4];
  explicit_location_info input_explicit_locations [32] [4];
  glsl_symbol_table local_1858;
  explicit_location_info local_1838 [128];
  explicit_location_info local_c38 [128];
  
  glsl_symbol_table::glsl_symbol_table(&local_1858);
  memset(local_1838,0,0xc00);
  memset(local_c38,0,0xc00);
  peVar1 = (producer->ir->head_sentinel).next;
  if (peVar1->next != (exec_node *)0x0) {
    do {
      bVar4 = false;
      if ((*(int *)&peVar1[1].next == 7) && ((*(uint *)&peVar1[3].prev & 0xf000) == 0x5000)) {
        if (((*(uint *)&peVar1[3].prev >> 0x12 & 1) == 0) || (*(int *)&peVar1[4].prev < 0x20)) {
          glsl_symbol_table::add_variable(&local_1858,(ir_variable *)&peVar1[-1].prev);
        }
        else {
          bVar3 = validate_explicit_variable_location
                            (ctx,(explicit_location_info (*) [4])local_1838,
                             (ir_variable *)&peVar1[-1].prev,prog,producer);
          bVar4 = true;
          if (!bVar3) goto LAB_001ed563;
        }
        bVar4 = false;
      }
LAB_001ed563:
      if (bVar4) goto LAB_001ed8f9;
      peVar1 = peVar1->next;
    } while (peVar1->next != (exec_node *)0x0);
  }
  peVar1 = (consumer->ir->head_sentinel).next;
  peVar2 = peVar1->next;
  while (peVar2 != (exec_node *)0x0) {
    var = &peVar1[-1].prev;
    iVar5 = 7;
    if ((*(int *)&peVar1[1].next == 7) &&
       (uVar6 = *(uint *)&peVar1[3].prev, (uVar6 & 0xf000) == 0x4000)) {
      peVar2 = peVar1[2].next;
      iVar5 = strcmp((char *)peVar2,"gl_Color");
      if (((char)uVar6 < '\0') && (iVar5 == 0)) {
        piVar8 = glsl_symbol_table::get_variable(&local_1858,"gl_FrontColor");
        piVar9 = glsl_symbol_table::get_variable(&local_1858,"gl_BackColor");
        cross_validate_front_and_back_color
                  (ctx,prog,(ir_variable *)var,piVar8,piVar9,consumer->Stage,producer->Stage);
      }
      else {
        iVar5 = strcmp((char *)peVar2,"gl_SecondaryColor");
        if (((char)uVar6 < '\0') && (iVar5 == 0)) {
          piVar8 = glsl_symbol_table::get_variable(&local_1858,"gl_FrontSecondaryColor");
          piVar9 = glsl_symbol_table::get_variable(&local_1858,"gl_BackSecondaryColor");
          cross_validate_front_and_back_color
                    (ctx,prog,(ir_variable *)var,piVar8,piVar9,consumer->Stage,producer->Stage);
        }
        else {
          if (((uVar6 >> 0x12 & 1) == 0) || (*(int *)&peVar1[4].prev < 0x20)) {
            piVar8 = glsl_symbol_table::get_variable(&local_1858,(char *)peVar2);
          }
          else {
            this = get_varying_type((ir_variable *)var,consumer->Stage);
            uVar6 = glsl_type::count_vec4_slots(this,false,true);
            uVar7 = compute_variable_location_slot((ir_variable *)var,consumer->Stage);
            bVar4 = validate_explicit_variable_location
                              (ctx,(explicit_location_info (*) [4])local_c38,(ir_variable *)var,prog
                               ,consumer);
            if (bVar4) {
              bVar3 = true;
              bVar4 = true;
              if (uVar7 + uVar6 <= uVar7) goto LAB_001ed801;
              uVar11 = 0x20;
              if (0x20 < uVar7) {
                uVar11 = (ulong)uVar7;
              }
              if (uVar7 < 0x20) {
                peVar13 = local_1838 +
                          (ulong)(*(uint *)&peVar1[3].prev >> 0x1d & 3) + (ulong)uVar7 * 4;
                lVar12 = 0;
                do {
                  piVar8 = peVar13->var;
                  if (piVar8 == (ir_variable *)0x0) {
                    if ((char)*(uint *)&peVar1[3].prev < '\0') {
                      pcVar10 = _mesa_shader_stage_to_string(consumer->Stage);
                      linker_error(prog,
                                   "%s shader input `%s\' with explicit location has no matching output\n"
                                   ,pcVar10,peVar1[2].next);
                      bVar4 = true;
                      goto LAB_001ed801;
                    }
                  }
                  else if (*(int *)&peVar1[4].prev != (piVar8->data).location) {
                    pcVar10 = _mesa_shader_stage_to_string(consumer->Stage);
                    linker_error(prog,
                                 "%s shader input `%s\' with explicit location has no matching output\n"
                                 ,pcVar10,peVar1[2].next);
                    bVar3 = true;
                    goto LAB_001ed803;
                  }
                  if (uVar6 - 1 == (int)lVar12) goto LAB_001ed803;
                  lVar12 = lVar12 + 1;
                  peVar13 = peVar13 + 4;
                } while ((uVar7 - uVar11) + lVar12 != 0);
                uVar7 = uVar7 + (int)lVar12;
              }
              else {
                piVar8 = (ir_variable *)0x0;
              }
              pcVar10 = _mesa_shader_stage_to_string(consumer->Stage);
              linker_error(prog,"Invalid location %u in %s shader\n",(ulong)uVar7,pcVar10);
              bVar3 = false;
            }
            else {
              bVar4 = false;
LAB_001ed801:
              bVar3 = bVar4;
              piVar8 = (ir_variable *)0x0;
            }
LAB_001ed803:
            iVar5 = 1;
            if (!bVar3) goto LAB_001ed788;
          }
          if (piVar8 == (ir_variable *)0x0) {
            uVar6 = *(uint *)&peVar1[3].prev;
            if ((uVar6 >> 8 & 1) != 0) {
              __assert_fail("!input->data.assigned",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                            ,0x36f,
                            "void cross_validate_outputs_to_inputs(struct gl_context *, struct gl_shader_program *, gl_linked_shader *, gl_linked_shader *)"
                           );
            }
            iVar5 = 0;
            if ((((char)uVar6 < '\0') && ((uVar6 >> 0x12 & 1) == 0)) &&
               (peVar1[8].next == (exec_node *)0x0)) {
              pcVar10 = _mesa_shader_stage_to_string(consumer->Stage);
              iVar5 = 0;
              linker_error(prog,
                           "%s shader input `%s\' has no matching output in the previous stage\n",
                           pcVar10,peVar1[2].next);
            }
            goto LAB_001ed788;
          }
          if ((peVar1[8].next == (exec_node *)0x0) || (piVar8->interface_type == (glsl_type *)0x0))
          {
            cross_validate_types_and_qualifiers
                      (ctx,prog,(ir_variable *)var,piVar8,consumer->Stage,producer->Stage);
          }
        }
      }
      iVar5 = 0;
    }
LAB_001ed788:
    if ((iVar5 != 7) && (iVar5 != 0)) break;
    peVar1 = peVar1->next;
    peVar2 = peVar1->next;
  }
LAB_001ed8f9:
  glsl_symbol_table::~glsl_symbol_table(&local_1858);
  return;
}

Assistant:

void
cross_validate_outputs_to_inputs(struct gl_context *ctx,
                                 struct gl_shader_program *prog,
                                 gl_linked_shader *producer,
                                 gl_linked_shader *consumer)
{
   glsl_symbol_table parameters;
   struct explicit_location_info output_explicit_locations[MAX_VARYING][4] = {};
   struct explicit_location_info input_explicit_locations[MAX_VARYING][4] = {};

   /* Find all shader outputs in the "producer" stage.
    */
   foreach_in_list(ir_instruction, node, producer->ir) {
      ir_variable *const var = node->as_variable();

      if (var == NULL || var->data.mode != ir_var_shader_out)
         continue;

      if (!var->data.explicit_location
          || var->data.location < VARYING_SLOT_VAR0)
         parameters.add_variable(var);
      else {
         /* User-defined varyings with explicit locations are handled
          * differently because they do not need to have matching names.
          */
         if (!validate_explicit_variable_location(ctx,
                                                  output_explicit_locations,
                                                  var, prog, producer)) {
            return;
         }
      }
   }


   /* Find all shader inputs in the "consumer" stage.  Any variables that have
    * matching outputs already in the symbol table must have the same type and
    * qualifiers.
    *
    * Exception: if the consumer is the geometry shader, then the inputs
    * should be arrays and the type of the array element should match the type
    * of the corresponding producer output.
    */
   foreach_in_list(ir_instruction, node, consumer->ir) {
      ir_variable *const input = node->as_variable();

      if (input == NULL || input->data.mode != ir_var_shader_in)
         continue;

      if (strcmp(input->name, "gl_Color") == 0 && input->data.used) {
         const ir_variable *const front_color =
            parameters.get_variable("gl_FrontColor");

         const ir_variable *const back_color =
            parameters.get_variable("gl_BackColor");

         cross_validate_front_and_back_color(ctx, prog, input,
                                             front_color, back_color,
                                             consumer->Stage, producer->Stage);
      } else if (strcmp(input->name, "gl_SecondaryColor") == 0 && input->data.used) {
         const ir_variable *const front_color =
            parameters.get_variable("gl_FrontSecondaryColor");

         const ir_variable *const back_color =
            parameters.get_variable("gl_BackSecondaryColor");

         cross_validate_front_and_back_color(ctx, prog, input,
                                             front_color, back_color,
                                             consumer->Stage, producer->Stage);
      } else {
         /* The rules for connecting inputs and outputs change in the presence
          * of explicit locations.  In this case, we no longer care about the
          * names of the variables.  Instead, we care only about the
          * explicitly assigned location.
          */
         ir_variable *output = NULL;
         if (input->data.explicit_location
             && input->data.location >= VARYING_SLOT_VAR0) {

            const glsl_type *type = get_varying_type(input, consumer->Stage);
            unsigned num_elements = type->count_attribute_slots(false);
            unsigned idx =
               compute_variable_location_slot(input, consumer->Stage);
            unsigned slot_limit = idx + num_elements;

            if (!validate_explicit_variable_location(ctx,
                                                     input_explicit_locations,
                                                     input, prog, consumer)) {
               return;
            }

            while (idx < slot_limit) {
               if (idx >= MAX_VARYING) {
                  linker_error(prog,
                               "Invalid location %u in %s shader\n", idx,
                               _mesa_shader_stage_to_string(consumer->Stage));
                  return;
               }

               output = output_explicit_locations[idx][input->data.location_frac].var;

               if (output == NULL) {
                  /* A linker failure should only happen when there is no
                   * output declaration and there is Static Use of the
                   * declared input.
                   */
                  if (input->data.used) {
                     linker_error(prog,
                                  "%s shader input `%s' with explicit location "
                                  "has no matching output\n",
                                  _mesa_shader_stage_to_string(consumer->Stage),
                                  input->name);
                     break;
                  }
               } else if (input->data.location != output->data.location) {
                  linker_error(prog,
                               "%s shader input `%s' with explicit location "
                               "has no matching output\n",
                               _mesa_shader_stage_to_string(consumer->Stage),
                               input->name);
                  break;
               }
               idx++;
            }
         } else {
            output = parameters.get_variable(input->name);
         }

         if (output != NULL) {
            /* Interface blocks have their own validation elsewhere so don't
             * try validating them here.
             */
            if (!(input->get_interface_type() &&
                  output->get_interface_type()))
               cross_validate_types_and_qualifiers(ctx, prog, input, output,
                                                   consumer->Stage,
                                                   producer->Stage);
         } else {
            /* Check for input vars with unmatched output vars in prev stage
             * taking into account that interface blocks could have a matching
             * output but with different name, so we ignore them.
             */
            assert(!input->data.assigned);
            if (input->data.used && !input->get_interface_type() &&
                !input->data.explicit_location)
               linker_error(prog,
                            "%s shader input `%s' "
                            "has no matching output in the previous stage\n",
                            _mesa_shader_stage_to_string(consumer->Stage),
                            input->name);
         }
      }
   }
}